

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O3

TestCaseGroup * deqp::egl::createThreadCleanUpTest(EglTestContext *eglTestCtx)

{
  TestCaseGroup *this;
  ThreadCleanUpTest *pTVar1;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,eglTestCtx,"thread_cleanup","Thread cleanup tests");
  pTVar1 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar1,eglTestCtx,CONTEXTTYPE_SINGLE,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar1,eglTestCtx,CONTEXTTYPE_MULTI,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar1,eglTestCtx,CONTEXTTYPE_SINGLE,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar1,eglTestCtx,CONTEXTTYPE_MULTI,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return this;
}

Assistant:

TestCaseGroup* createThreadCleanUpTest (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "thread_cleanup", "Thread cleanup tests"));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_SINGLE));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_SINGLE));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_MULTI));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_MULTI));

	return group.release();
}